

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnInitExprGetGlobalExpr
          (BinaryReaderIR *this,Index index,Index global_index)

{
  Var *this_00;
  char *__s;
  Offset OVar1;
  ExprList *pEVar2;
  Expr *pEVar3;
  Expr *pEVar4;
  size_t sVar5;
  ExprList *pEVar6;
  undefined1 auStack_98 [8];
  Location loc;
  Expr *local_30;
  
  loc.filename.size_._0_4_ = 0;
  loc.filename.size_._4_4_ = 0;
  loc.field_1.field_0.line = 0;
  auStack_98 = (undefined1  [8])0x0;
  loc.filename.data_._0_4_ = 0;
  loc.filename.data_._4_4_ = 0;
  __s = this->filename_;
  sVar5 = strlen(__s);
  loc.filename.data_._0_4_ = (undefined4)sVar5;
  loc.filename.data_._4_4_ = (undefined4)(sVar5 >> 0x20);
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc.filename.size_._0_4_ = (undefined4)OVar1;
  loc.filename.size_._4_4_ = (undefined4)(OVar1 >> 0x20);
  pEVar2 = this->current_init_expr_;
  this_00 = (Var *)((long)&loc.field_1 + 8);
  auStack_98 = (undefined1  [8])__s;
  Var::Var(this_00,global_index,(Location *)auStack_98);
  MakeUnique<wabt::VarExpr<(wabt::ExprType)17>,wabt::Var,wabt::Location&>
            ((wabt *)&local_30,this_00,(Location *)auStack_98);
  pEVar4 = local_30;
  local_30 = (Expr *)0x0;
  if (((pEVar4->super_intrusive_list_base<wabt::Expr>).prev_ == (Expr *)0x0) &&
     ((pEVar4->super_intrusive_list_base<wabt::Expr>).next_ == (Expr *)0x0)) {
    pEVar3 = pEVar2->last_;
    pEVar6 = pEVar2;
    if (pEVar3 != (Expr *)0x0) {
      (pEVar4->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar3;
      pEVar6 = (ExprList *)&pEVar3->super_intrusive_list_base<wabt::Expr>;
    }
    pEVar6->first_ = pEVar4;
    pEVar2->last_ = pEVar4;
    pEVar2->size_ = pEVar2->size_ + 1;
    local_30 = (Expr *)0x0;
    Var::~Var((Var *)((long)&loc.field_1 + 8));
    return (Result)Ok;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/intrusive-list.h"
                ,0x1bf,
                "void wabt::intrusive_list<wabt::Expr>::push_back(std::unique_ptr<T>) [T = wabt::Expr]"
               );
}

Assistant:

Result BinaryReaderIR::OnInitExprGetGlobalExpr(Index index,
                                               Index global_index) {
  Location loc = GetLocation();
  current_init_expr_->push_back(
      MakeUnique<GetGlobalExpr>(Var(global_index, loc), loc));
  return Result::Ok;
}